

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O3

void __thiscall NodeKey::dump(NodeKey *this)

{
  ostream *poVar1;
  long *plVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
       0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Flags: 0x",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Size1: 0x",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Size2: 0x",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Node index: 0x",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Volume index: 0x",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Sector index: 0x",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Has compression: ",0x11);
  pcVar5 = "true";
  pcVar4 = "true";
  uVar3 = this->m_flags & 1;
  if (uVar3 == 0) {
    pcVar4 = "false";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,(ulong)uVar3 ^ 5);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Has bit 4: ",0xb);
  bVar6 = (this->m_flags & 0x10) == 0;
  pcVar4 = "true";
  if (bVar6) {
    pcVar4 = "false";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,(ulong)bVar6 | 4);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Has bit 5: ",0xb);
  bVar6 = (this->m_flags & 0x20) == 0;
  if (bVar6) {
    pcVar5 = "false";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,(ulong)bVar6 | 4);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x18) =
       *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void NodeKey::dump() const
{
	std::cout
		<< std::hex
		<< "Flags: 0x" << flags() << std::endl
		<< "Size1: 0x" << size1() << std::endl
		<< "Size2: 0x" << size2() << std::endl
		<< "Node index: 0x" << nodeIndex() << std::endl
		<< "Volume index: 0x" << volumeIndex() << std::endl
		<< "Sector index: 0x" << sectorIndex() << std::endl
		<< "Has compression: " << (hasCompression() ? "true" : "false") << std::endl
		<< "Has bit 4: " << (hasBit4() ? "true" : "false") << std::endl
		<< "Has bit 5: " << (hasBit5() ? "true" : "false") << std::endl
		<< std::dec << std::endl;
}